

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool lexer_CaptureMacroBody(CaptureBody *capture)

{
  uint uVar1;
  int iVar2;
  LexerState *pLVar3;
  bool bVar4;
  
  startCapture(capture);
  pLVar3 = lexerState;
  if (lexerState->isMmapped == true) {
    (lexerState->field_2).field_0.isReferenced = true;
  }
  if (pLVar3->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9f7,"lexer_CaptureMacroBody");
  }
LAB_0010dec7:
  do {
    pLVar3->lineNo = pLVar3->lineNo + 1;
    pLVar3->colNo = 1;
    uVar1 = peek();
    while (uVar1 != 0xffffffff) {
      shiftChar();
      if ((uVar1 != 0x20) && (uVar1 != 9)) {
        if (((0x19 < (uVar1 & 0xffffffdf) - 0x41) && ((uVar1 != 0x5f && (uVar1 != 0x2e)))) ||
           (iVar2 = readIdentifier((char)uVar1), pLVar3 = lexerState, iVar2 != 0x6c))
        goto LAB_0010defd;
        lexerState->captureSize = lexerState->captureSize - 4;
        bVar4 = true;
        goto LAB_0010df87;
      }
      uVar1 = peek();
    }
    uVar1 = 0xffffffff;
LAB_0010defd:
    if (uVar1 != 0xd) {
      pLVar3 = lexerState;
      if (uVar1 == 10) goto LAB_0010dec7;
      if (uVar1 == 0xffffffff) {
        bVar4 = false;
        error("Unterminated macro definition\n");
        pLVar3 = lexerState;
LAB_0010df87:
        if (capture->body == (char *)0x0) {
          capture->body = pLVar3->captureBuf;
        }
        capture->size = pLVar3->captureSize;
        pLVar3->capturing = false;
        pLVar3->captureBuf = (char *)0x0;
        pLVar3->disableMacroArgs = false;
        pLVar3->disableInterpolation = false;
        pLVar3->atLineStart = false;
        return bVar4;
      }
      uVar1 = peek();
      if (uVar1 != 0xffffffff) {
        shiftChar();
      }
      goto LAB_0010defd;
    }
    iVar2 = peek();
    pLVar3 = lexerState;
    if (iVar2 == 10) {
      shiftChar();
      pLVar3 = lexerState;
    }
  } while( true );
}

Assistant:

bool lexer_CaptureMacroBody(struct CaptureBody *capture)
{
	startCapture(capture);

	// If the file is `mmap`ed, we need not to unmap it to keep access to the macro
	if (lexerState->isMmapped)
		lexerState->isReferenced = true;

	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match an `ENDM` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `ENDM` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_ENDM:
				// The ENDM has been captured, but we don't want it!
				// We know we have read exactly "ENDM", not e.g. an EQUS
				lexerState->captureSize -= strlen("ENDM");
				goto finish;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated macro definition\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDM or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDM terminated the block, false if it reached EOF first
	return c != EOF;
}